

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

void __thiscall Parser::CheckIfImportOrExportStatementValidHere(Parser *this)

{
  ParseNodeFnc *pPVar1;
  HRESULT hr;
  Parser *this_00;
  
  this_00 = this;
  pPVar1 = GetCurrentFunctionNode(this);
  if (((pPVar1->super_ParseNode).nop == knopFncDecl) &&
     ((pPVar1->fncFlags & kFunctionIsModule) != kFunctionNone)) {
    if (((this->m_currentBlockInfo->pnodeBlock == pPVar1->pnodeBodyScope) &&
        ((this->m_grfscr & 0x800) == 0 && this->m_tryCatchOrFinallyDepth == 0)) &&
       (this->m_disallowImportExportStmt != true)) {
      return;
    }
    hr = -0x7ff5fbc2;
  }
  else {
    hr = -0x7ff5fbb3;
  }
  Error(this_00,hr,L"",L"");
}

Assistant:

void Parser::CheckIfImportOrExportStatementValidHere()
{
    ParseNodeFnc * curFunc = GetCurrentFunctionNode();

    if (curFunc->nop != knopFncDecl || !curFunc->IsModule())
    {
        Error(ERRModuleImportOrExportInScript);
    }

    if (this->m_currentBlockInfo->pnodeBlock != curFunc->pnodeBodyScope
        || (this->m_grfscr & fscrEvalCode) == fscrEvalCode
        || this->m_tryCatchOrFinallyDepth != 0
        || this->m_disallowImportExportStmt)
    {
        Error(ERRInvalidModuleImportOrExport);
    }
}